

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O2

int delete_if_mapped(X509_POLICY_NODE *node,void *data)

{
  int iVar1;
  POLICY_MAPPING mapping;
  
  iVar1 = OPENSSL_sk_is_sorted((OPENSSL_STACK *)data);
  if (iVar1 != 0) {
    mapping.issuerDomainPolicy = node->policy;
    iVar1 = sk_POLICY_MAPPING_find((stack_st_POLICY_MAPPING *)data,(size_t *)0x0,&mapping);
    if (iVar1 != 0) {
      x509_policy_node_free(node);
    }
    return (uint)(iVar1 != 0);
  }
  __assert_fail("sk_POLICY_MAPPING_is_sorted(mappings)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                ,0x14d,"int delete_if_mapped(X509_POLICY_NODE *, void *)");
}

Assistant:

static int delete_if_mapped(X509_POLICY_NODE *node, void *data) {
  const POLICY_MAPPINGS *mappings = reinterpret_cast<POLICY_MAPPINGS *>(data);
  // |mappings| must have been sorted by |compare_issuer_policy|.
  assert(sk_POLICY_MAPPING_is_sorted(mappings));
  POLICY_MAPPING mapping;
  mapping.issuerDomainPolicy = node->policy;
  if (!sk_POLICY_MAPPING_find(mappings, /*out_index=*/NULL, &mapping)) {
    return 0;
  }
  x509_policy_node_free(node);
  return 1;
}